

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.h
# Opt level: O0

void __thiscall TypeRef::TypeRef(TypeRef *this,InplaceStr name,TypeBase *subType)

{
  TypeBase *subType_local;
  TypeRef *this_local;
  InplaceStr name_local;
  
  TypeBase::TypeBase(&this->super_TypeBase,0x12,name);
  (this->super_TypeBase)._vptr_TypeBase = (_func_int **)&PTR__TypeRef_00307c00;
  this->subType = subType;
  (this->super_TypeBase).size = 8;
  (this->super_TypeBase).alignment = 4;
  (this->super_TypeBase).isGeneric = (bool)(subType->isGeneric & 1);
  (this->super_TypeBase).hasPointers = true;
  return;
}

Assistant:

TypeRef(InplaceStr name, TypeBase *subType): TypeBase(myTypeID, name), subType(subType)
	{
		size = NULLC_PTR_SIZE;
		alignment = 4;

		isGeneric = subType->isGeneric;

		hasPointers = true;
	}